

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_peer.cpp
# Opt level: O2

uint32_t libtorrent::aux::peer_priority(endpoint *e1,endpoint *e2)

{
  ushort uVar1;
  sa_family_t sVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  unsigned_short data;
  uint32_t uVar9;
  uint32_t uVar10;
  int iVar11;
  long lVar12;
  bool bVar13;
  pointer ptr;
  anon_union_16_3_a3f0114d_for___in6_u aStack_80;
  uint32_t local_70;
  undefined4 uStack_6c;
  undefined1 local_68 [16];
  array<char,_4UL> buf;
  undefined8 uStack_50;
  undefined8 local_38;
  undefined8 uStack_30;
  
  bVar13 = (e1->impl_).data_.base.sa_family != 2;
  if (bVar13) {
    uVar3 = *(undefined8 *)((long)&(e1->impl_).data_ + 8);
    uVar4 = *(undefined8 *)((long)&(e1->impl_).data_ + 0x10);
    aStack_80.__u6_addr32[0] = (uint32_t)uVar3;
    aStack_80.__u6_addr32[1] = (uint32_t)((ulong)uVar3 >> 0x20);
    aStack_80.__u6_addr32[2] = (uint32_t)uVar4;
    aStack_80.__u6_addr32[3] = (uint32_t)((ulong)uVar4 >> 0x20);
    local_70 = (e1->impl_).data_.v6.sin6_scope_id;
    uVar9 = 0;
  }
  else {
    uVar9 = (e1->impl_).data_.v6.sin6_flowinfo;
    aStack_80.__u6_addr32[0] = 0;
    aStack_80.__u6_addr32[1] = 0;
    aStack_80.__u6_addr32[2] = 0;
    aStack_80.__u6_addr32[3] = 0;
    local_70 = 0;
  }
  uStack_6c = 0;
  ptr = (pointer)CONCAT44(uVar9,(uint)bVar13);
  buf._M_elems[0] = (e2->impl_).data_.base.sa_family != 2;
  if ((bool)buf._M_elems[0]) {
    uStack_50 = *(undefined8 *)((long)&(e2->impl_).data_ + 8);
    uVar9 = 0;
  }
  else {
    uVar9 = (e2->impl_).data_.v6.sin6_flowinfo;
    uStack_50 = 0;
  }
  buf._M_elems[1] = '\0';
  buf._M_elems[2] = '\0';
  buf._M_elems[3] = '\0';
  bVar13 = boost::asio::ip::operator==((address *)&ptr,(address *)&buf);
  if (bVar13) {
    uVar1 = (e1->impl_).data_.v4.sin_port;
    data = uVar1 << 8 | uVar1 >> 8;
    uVar1 = (e2->impl_).data_.v4.sin_port;
    if ((ushort)(uVar1 << 8 | uVar1 >> 8) < data) {
      uVar3 = *(undefined8 *)&(e1->impl_).data_;
      uVar4 = *(undefined8 *)((long)&(e1->impl_).data_ + 8);
      uVar5 = *(undefined8 *)((long)&(e1->impl_).data_ + 0x14);
      aStack_80.__u6_addr32[2] =
           (uint32_t)((ulong)*(undefined8 *)((long)&(e1->impl_).data_ + 0xc) >> 0x20);
      aStack_80.__u6_addr32[3] = (uint32_t)uVar5;
      local_70 = (uint32_t)((ulong)uVar5 >> 0x20);
      aStack_80.__u6_addr32[0] = (uint32_t)uVar4;
      aStack_80.__u6_addr32[1] = (uint32_t)((ulong)uVar4 >> 0x20);
      uVar6 = *(undefined8 *)&(e2->impl_).data_;
      uVar7 = *(undefined8 *)((long)&(e2->impl_).data_ + 8);
      uVar8 = *(undefined8 *)((long)&(e2->impl_).data_ + 0x14);
      *(undefined8 *)((long)&(e1->impl_).data_ + 0xc) =
           *(undefined8 *)((long)&(e2->impl_).data_ + 0xc);
      *(undefined8 *)((long)&(e1->impl_).data_ + 0x14) = uVar8;
      *(undefined8 *)&(e1->impl_).data_ = uVar6;
      *(undefined8 *)((long)&(e1->impl_).data_ + 8) = uVar7;
      *(ulong *)((long)&(e2->impl_).data_ + 0xc) =
           CONCAT44(aStack_80.__u6_addr32[2],aStack_80.__u6_addr32[1]);
      *(undefined8 *)((long)&(e2->impl_).data_ + 0x14) = uVar5;
      *(undefined8 *)&(e2->impl_).data_ = uVar3;
      *(undefined8 *)((long)&(e2->impl_).data_ + 8) = uVar4;
      uVar1 = (e1->impl_).data_.v4.sin_port;
      data = uVar1 << 8 | uVar1 >> 8;
    }
    ptr = (pointer)&buf;
    write_impl<unsigned_short,unsigned_short,char*>(data,&ptr);
    uVar1 = (e2->impl_).data_.v4.sin_port;
    write_impl<unsigned_short,unsigned_short,char*>(uVar1 << 8 | uVar1 >> 8,&ptr);
    uVar9 = crc32c_32(CONCAT22(buf._M_elems._2_2_,buf._M_elems._0_2_));
  }
  else {
    sVar2 = (e1->impl_).data_.base.sa_family;
    bVar13 = boost::asio::ip::detail::operator<(&e2->impl_,&e1->impl_);
    if (sVar2 == 2) {
      if (bVar13) {
        uVar3 = *(undefined8 *)&(e1->impl_).data_;
        uVar4 = *(undefined8 *)((long)&(e1->impl_).data_ + 8);
        uVar5 = *(undefined8 *)((long)&(e1->impl_).data_ + 0x14);
        aStack_80.__u6_addr32[2] =
             (uint32_t)((ulong)*(undefined8 *)((long)&(e1->impl_).data_ + 0xc) >> 0x20);
        aStack_80.__u6_addr32[1] = (uint32_t)((ulong)uVar4 >> 0x20);
        uVar6 = *(undefined8 *)&(e2->impl_).data_;
        uVar7 = *(undefined8 *)((long)&(e2->impl_).data_ + 8);
        uVar8 = *(undefined8 *)((long)&(e2->impl_).data_ + 0x14);
        *(undefined8 *)((long)&(e1->impl_).data_ + 0xc) =
             *(undefined8 *)((long)&(e2->impl_).data_ + 0xc);
        *(undefined8 *)((long)&(e1->impl_).data_ + 0x14) = uVar8;
        *(undefined8 *)&(e1->impl_).data_ = uVar6;
        *(undefined8 *)((long)&(e1->impl_).data_ + 8) = uVar7;
        *(ulong *)((long)&(e2->impl_).data_ + 0xc) =
             CONCAT44(aStack_80.__u6_addr32[2],aStack_80.__u6_addr32[1]);
        *(undefined8 *)((long)&(e2->impl_).data_ + 0x14) = uVar5;
        *(undefined8 *)&(e2->impl_).data_ = uVar3;
        *(undefined8 *)((long)&(e2->impl_).data_ + 8) = uVar4;
      }
      bVar13 = (e1->impl_).data_.base.sa_family != 2;
      if (bVar13) {
        uVar3 = *(undefined8 *)((long)&(e1->impl_).data_ + 8);
        uVar4 = *(undefined8 *)((long)&(e1->impl_).data_ + 0x10);
        aStack_80.__u6_addr32[0] = (uint32_t)uVar3;
        aStack_80.__u6_addr32[1] = (uint32_t)((ulong)uVar3 >> 0x20);
        aStack_80.__u6_addr32[2] = (uint32_t)uVar4;
        aStack_80.__u6_addr32[3] = (uint32_t)((ulong)uVar4 >> 0x20);
        local_70 = (e1->impl_).data_.v6.sin6_scope_id;
        uVar9 = 0;
      }
      else {
        uVar9 = (e1->impl_).data_.v6.sin6_flowinfo;
        aStack_80.__u6_addr32[0] = 0;
        aStack_80.__u6_addr32[1] = 0;
        aStack_80.__u6_addr32[2] = 0;
        aStack_80.__u6_addr32[3] = 0;
        local_70 = 0;
      }
      uStack_6c = 0;
      ptr = (pointer)CONCAT44(uVar9,(uint)bVar13);
      boost::asio::ip::address::to_v4((address *)&buf);
      bVar13 = (e2->impl_).data_.base.sa_family != 2;
      if (bVar13) {
        uVar3 = *(undefined8 *)((long)&(e2->impl_).data_ + 8);
        uVar4 = *(undefined8 *)((long)&(e2->impl_).data_ + 0x10);
        aStack_80.__u6_addr32[0] = (uint32_t)uVar3;
        aStack_80.__u6_addr32[1] = (uint32_t)((ulong)uVar3 >> 0x20);
        aStack_80.__u6_addr32[2] = (uint32_t)uVar4;
        aStack_80.__u6_addr32[3] = (uint32_t)((ulong)uVar4 >> 0x20);
        local_70 = (e2->impl_).data_.v6.sin6_scope_id;
        uVar9 = 0;
      }
      else {
        uVar9 = (e2->impl_).data_.v6.sin6_flowinfo;
        aStack_80.__u6_addr32[0] = 0;
        aStack_80.__u6_addr32[1] = 0;
        aStack_80.__u6_addr32[2] = 0;
        aStack_80.__u6_addr32[3] = 0;
        local_70 = 0;
      }
      uStack_6c = 0;
      ptr = (pointer)CONCAT44(uVar9,(uint)bVar13);
      boost::asio::ip::address::to_v4((address *)local_68);
      if (buf._M_elems._0_2_ == local_68._0_2_) {
        iVar11 = bcmp(&buf,local_68,3);
        lVar12 = (ulong)(iVar11 == 0) + 1;
      }
      else {
        lVar12 = 0;
      }
      anon_unknown_16::apply_mask((uint8_t *)&buf,peer_priority::v4mask[lVar12],4);
      anon_unknown_16::apply_mask(local_68,peer_priority::v4mask[lVar12],4);
      ptr = (pointer)CONCAT44(local_68._0_4_,CONCAT22(buf._M_elems._2_2_,buf._M_elems._0_2_));
      iVar11 = 1;
    }
    else {
      if (bVar13) {
        uVar3 = *(undefined8 *)&(e1->impl_).data_;
        uVar4 = *(undefined8 *)((long)&(e1->impl_).data_ + 8);
        uVar5 = *(undefined8 *)((long)&(e1->impl_).data_ + 0x14);
        aStack_80.__u6_addr32[2] =
             (uint32_t)((ulong)*(undefined8 *)((long)&(e1->impl_).data_ + 0xc) >> 0x20);
        aStack_80.__u6_addr32[1] = (uint32_t)((ulong)uVar4 >> 0x20);
        uVar6 = *(undefined8 *)&(e2->impl_).data_;
        uVar7 = *(undefined8 *)((long)&(e2->impl_).data_ + 8);
        uVar8 = *(undefined8 *)((long)&(e2->impl_).data_ + 0x14);
        *(undefined8 *)((long)&(e1->impl_).data_ + 0xc) =
             *(undefined8 *)((long)&(e2->impl_).data_ + 0xc);
        *(undefined8 *)((long)&(e1->impl_).data_ + 0x14) = uVar8;
        *(undefined8 *)&(e1->impl_).data_ = uVar6;
        *(undefined8 *)((long)&(e1->impl_).data_ + 8) = uVar7;
        *(ulong *)((long)&(e2->impl_).data_ + 0xc) =
             CONCAT44(aStack_80.__u6_addr32[2],aStack_80.__u6_addr32[1]);
        *(undefined8 *)((long)&(e2->impl_).data_ + 0x14) = uVar5;
        *(undefined8 *)&(e2->impl_).data_ = uVar3;
        *(undefined8 *)((long)&(e2->impl_).data_ + 8) = uVar4;
      }
      bVar13 = (e1->impl_).data_.base.sa_family != 2;
      if (bVar13) {
        uVar3 = *(undefined8 *)((long)&(e1->impl_).data_ + 8);
        uVar4 = *(undefined8 *)((long)&(e1->impl_).data_ + 0x10);
        aStack_80.__u6_addr32[0] = (uint32_t)uVar3;
        aStack_80.__u6_addr32[1] = (uint32_t)((ulong)uVar3 >> 0x20);
        aStack_80.__u6_addr32[2] = (uint32_t)uVar4;
        aStack_80.__u6_addr32[3] = (uint32_t)((ulong)uVar4 >> 0x20);
        local_70 = (e1->impl_).data_.v6.sin6_scope_id;
        uVar10 = 0;
      }
      else {
        uVar10 = (e1->impl_).data_.v6.sin6_flowinfo;
        aStack_80.__u6_addr32[0] = 0;
        aStack_80.__u6_addr32[1] = 0;
        aStack_80.__u6_addr32[2] = 0;
        aStack_80.__u6_addr32[3] = 0;
        local_70 = 0;
      }
      uStack_6c = 0;
      ptr = (pointer)CONCAT44(uVar10,(uint)bVar13);
      boost::asio::ip::address::to_v6((address_v6 *)&buf,(address *)&ptr);
      local_68._0_8_ = CONCAT44(uVar9,CONCAT22(buf._M_elems._2_2_,buf._M_elems._0_2_));
      local_68._8_8_ = uStack_50;
      bVar13 = (e2->impl_).data_.base.sa_family != 2;
      if (bVar13) {
        uVar3 = *(undefined8 *)((long)&(e2->impl_).data_ + 8);
        uVar4 = *(undefined8 *)((long)&(e2->impl_).data_ + 0x10);
        aStack_80.__u6_addr32[0] = (uint32_t)uVar3;
        aStack_80.__u6_addr32[1] = (uint32_t)((ulong)uVar3 >> 0x20);
        aStack_80.__u6_addr32[2] = (uint32_t)uVar4;
        aStack_80.__u6_addr32[3] = (uint32_t)((ulong)uVar4 >> 0x20);
        local_70 = (e2->impl_).data_.v6.sin6_scope_id;
        uVar10 = 0;
      }
      else {
        uVar10 = (e2->impl_).data_.v6.sin6_flowinfo;
        aStack_80.__u6_addr32[0] = 0;
        aStack_80.__u6_addr32[1] = 0;
        aStack_80.__u6_addr32[2] = 0;
        aStack_80.__u6_addr32[3] = 0;
        local_70 = 0;
      }
      uStack_6c = 0;
      ptr = (pointer)CONCAT44(uVar10,(uint)bVar13);
      boost::asio::ip::address::to_v6((address_v6 *)&buf,(address *)&ptr);
      local_38 = CONCAT44(uVar9,CONCAT22(buf._M_elems._2_2_,buf._M_elems._0_2_));
      uStack_30 = uStack_50;
      if (local_68._0_4_ == CONCAT22(buf._M_elems._2_2_,buf._M_elems._0_2_)) {
        iVar11 = bcmp(local_68,&local_38,6);
        lVar12 = (ulong)(iVar11 == 0) + 1;
      }
      else {
        lVar12 = 0;
      }
      anon_unknown_16::apply_mask(local_68,peer_priority::v6mask[lVar12],8);
      anon_unknown_16::apply_mask((uint8_t *)&local_38,peer_priority::v6mask[lVar12],8);
      ptr = (pointer)local_68._0_8_;
      aStack_80.__u6_addr32[0] = (uint32_t)local_68._8_8_;
      aStack_80.__u6_addr32[1] = SUB84(local_68._8_8_,4);
      aStack_80.__u6_addr32[2] = (uint32_t)local_38;
      aStack_80.__u6_addr32[3] = (uint32_t)((ulong)local_38 >> 0x20);
      local_70 = (uint32_t)uStack_30;
      uStack_6c = (undefined4)((ulong)uStack_30 >> 0x20);
      iVar11 = 4;
    }
    uVar9 = crc32c((uint64_t *)&ptr,iVar11);
  }
  return uVar9;
}

Assistant:

std::uint32_t peer_priority(tcp::endpoint e1, tcp::endpoint e2)
	{
		TORRENT_ASSERT(aux::is_v4(e1) == aux::is_v4(e2));

		using std::swap;

		std::uint32_t ret;
		if (e1.address() == e2.address())
		{
			if (e1.port() > e2.port())
				swap(e1, e2);
			std::array<char, 4> buf;
			auto ptr = buf.data();
			aux::write_uint16(e1.port(), ptr);
			aux::write_uint16(e2.port(), ptr);
			std::uint32_t p;
			std::memcpy(&p, buf.data(), 4);
			ret = crc32c_32(p);
		}
		else if (aux::is_v6(e1))
		{
			static const std::uint8_t v6mask[][8] = {
				{ 0xff, 0xff, 0xff, 0xff, 0x55, 0x55, 0x55, 0x55 },
				{ 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0x55, 0x55 },
				{ 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff }
			};

			if (e1 > e2) swap(e1, e2);
			address_v6::bytes_type b1 = e1.address().to_v6().to_bytes();
			address_v6::bytes_type b2 = e2.address().to_v6().to_bytes();
			int const mask = std::memcmp(b1.data(), b2.data(), 4) ? 0
				: std::memcmp(b1.data(), b2.data(), 6) ? 1 : 2;
			apply_mask(b1.data(), v6mask[mask], 8);
			apply_mask(b2.data(), v6mask[mask], 8);
			std::uint64_t addrbuf[4];
			std::memcpy(&addrbuf[0], b1.data(), 16);
			std::memcpy(&addrbuf[2], b2.data(), 16);
			ret = aux::crc32c(addrbuf, 4);
		}
		else
		{
			static const std::uint8_t v4mask[][4] = {
				{ 0xff, 0xff, 0x55, 0x55 },
				{ 0xff, 0xff, 0xff, 0x55 },
				{ 0xff, 0xff, 0xff, 0xff }
			};

			if (e1 > e2) swap(e1, e2);
			address_v4::bytes_type b1 = e1.address().to_v4().to_bytes();
			address_v4::bytes_type b2 = e2.address().to_v4().to_bytes();
			int mask = std::memcmp(&b1[0], &b2[0], 2) ? 0
				: std::memcmp(&b1[0], &b2[0], 3) ? 1 : 2;
			apply_mask(&b1[0], v4mask[mask], 4);
			apply_mask(&b2[0], v4mask[mask], 4);
			std::uint64_t addrbuf;
			std::memcpy(&addrbuf, &b1[0], 4);
			std::memcpy(reinterpret_cast<char*>(&addrbuf) + 4, &b2[0], 4);
			ret = aux::crc32c(&addrbuf, 1);
		}

		return ret;
	}